

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

ctmbstr GetColorName(ctmbstr code)

{
  int iVar1;
  uint local_1c;
  uint i;
  ctmbstr code_local;
  
  local_1c = 0;
  while( true ) {
    if (colors[local_1c].name == (ctmbstr)0x0) {
      return (ctmbstr)0x0;
    }
    iVar1 = prvTidytmbstrcasecmp(code,colors[local_1c].hex);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return colors[local_1c].name;
}

Assistant:

static ctmbstr GetColorName(ctmbstr code)
{
    uint i;

    for (i = 0; colors[i].name; ++i)
        if (TY_(tmbstrcasecmp)(code, colors[i].hex) == 0)
            return colors[i].name;

    return NULL;
}